

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_b.c
# Opt level: O0

void test_option_b(void)

{
  wchar_t wVar1;
  size_t sVar2;
  char *__dest;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  char *testprog_ustar;
  char *in_stack_00000018;
  undefined4 in_stack_00000020;
  wchar_t in_stack_00000024;
  char *in_stack_00000028;
  long in_stack_00000080;
  char *in_stack_00000088;
  wchar_t in_stack_00000094;
  char *in_stack_00000098;
  char *in_stack_00000498;
  wchar_t in_stack_000004a4;
  char *in_stack_000004a8;
  char *in_stack_fffffffffffffff0;
  
  sVar2 = strlen(testprog);
  __dest = (char *)malloc(sVar2 + 0x11);
  strcpy(__dest,testprog);
  strcat(__dest," --format=ustar");
  assertion_make_file(in_stack_00000028,in_stack_00000024,in_stack_00000018,testprog_ustar._4_4_,
                      (wchar_t)testprog_ustar,in_stack_00000008);
  wVar1 = systemf("cat file1 > test_cat.out 2> test_cat.err");
  if (wVar1 == L'\0') {
    systemf("%s -cf archive1.tar file1 >test1.out 2>test1.err",__dest);
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__dest,in_stack_fffffffffffffff0,0
                        ,(char *)0x110edb,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    failure("bsdtar does not pad archives written directly to regular files");
    assertion_file_size(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000080);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    systemf("%s -cf - file1 2>test2.err | cat >archive2.tar ",__dest);
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__dest,in_stack_fffffffffffffff0,0
                        ,(char *)0x110f77,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    failure("bsdtar does pad archives written to pipes");
    assertion_file_size(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000080);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    systemf("%s -cf - -b 20 file1 2>test3.err | cat >archive3.tar ",__dest);
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__dest,in_stack_fffffffffffffff0,0
                        ,(char *)0x110ffb,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_file_size(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000080);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    systemf("%s -cf - -b 10 file1 2>test4.err | cat >archive4.tar ",__dest);
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__dest,in_stack_fffffffffffffff0,0
                        ,(char *)0x111071,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_file_size(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000080);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    systemf("%s -cf - -b 1 file1 2>test5.err | cat >archive5.tar ",__dest);
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__dest,in_stack_fffffffffffffff0,0
                        ,(char *)0x1110e7,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_file_size(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000080);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    systemf("%s -cf - -b 8192 file1 2>test6.err | cat >archive6.tar ",__dest);
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__dest,in_stack_fffffffffffffff0,0
                        ,(char *)0x11115d,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_file_size(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000080);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                   ,L'&');
    test_skipping("Platform doesn\'t have cat");
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_b)
{
	char *testprog_ustar = malloc(strlen(testprog) + sizeof(USTAR_OPT) + 1);
	strcpy(testprog_ustar, testprog);
	strcat(testprog_ustar, USTAR_OPT);

	assertMakeFile("file1", 0644, "file1");
	if (systemf("cat file1 > test_cat.out 2> test_cat.err") != 0) {
		skipping("Platform doesn't have cat");
		return;
	}

	/*
	 * Bsdtar does not pad if the output is going directly to a disk file.
	 */
	assertEqualInt(0, systemf("%s -cf archive1.tar file1 >test1.out 2>test1.err", testprog_ustar));
	failure("bsdtar does not pad archives written directly to regular files");
	assertFileSize("archive1.tar", 2048);
	assertEmptyFile("test1.out");
	assertEmptyFile("test1.err");

	/*
	 * Bsdtar does pad to the block size if the output is going to a socket.
	 */
	/* Default is -b 20 */
	assertEqualInt(0, systemf("%s -cf - file1 2>test2.err | cat >archive2.tar ", testprog_ustar));
	failure("bsdtar does pad archives written to pipes");
	assertFileSize("archive2.tar", 10240);
	assertEmptyFile("test2.err");

	assertEqualInt(0, systemf("%s -cf - -b 20 file1 2>test3.err | cat >archive3.tar ", testprog_ustar));
	assertFileSize("archive3.tar", 10240);
	assertEmptyFile("test3.err");

	assertEqualInt(0, systemf("%s -cf - -b 10 file1 2>test4.err | cat >archive4.tar ", testprog_ustar));
	assertFileSize("archive4.tar", 5120);
	assertEmptyFile("test4.err");

	assertEqualInt(0, systemf("%s -cf - -b 1 file1 2>test5.err | cat >archive5.tar ", testprog_ustar));
	assertFileSize("archive5.tar", 2048);
	assertEmptyFile("test5.err");

	assertEqualInt(0, systemf("%s -cf - -b 8192 file1 2>test6.err | cat >archive6.tar ", testprog_ustar));
	assertFileSize("archive6.tar", 4194304);
	assertEmptyFile("test6.err");

	/*
	 * Note: It's not possible to verify at this level that blocks
	 * are getting written with the
	 */
}